

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

float ncnn::reduction(float v0,float *ptr,int size,int op_type)

{
  ulong uVar1;
  float fVar2;
  float sum;
  
  switch(op_type) {
  case 0:
    if (0 < size) {
      uVar1 = 0;
      do {
        v0 = v0 + ptr[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)size != uVar1);
    }
    break;
  case 1:
    if (0 < size) {
      uVar1 = 0;
      do {
        v0 = v0 + ABS(ptr[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((uint)size != uVar1);
    }
    break;
  case 2:
    if (0 < size) {
      uVar1 = 0;
      do {
        v0 = v0 + ptr[uVar1] * ptr[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)size != uVar1);
    }
    break;
  case 3:
  case 7:
  case 8:
  case 9:
    break;
  case 4:
    if (0 < size) {
      uVar1 = 0;
      do {
        if (v0 <= ptr[uVar1]) {
          v0 = ptr[uVar1];
        }
        uVar1 = uVar1 + 1;
      } while ((uint)size != uVar1);
    }
    break;
  case 5:
    if (0 < size) {
      uVar1 = 0;
      do {
        if (ptr[uVar1] <= v0) {
          v0 = ptr[uVar1];
        }
        uVar1 = uVar1 + 1;
      } while ((uint)size != uVar1);
    }
    break;
  case 6:
    if (0 < size) {
      uVar1 = 0;
      do {
        v0 = v0 * ptr[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)size != uVar1);
    }
    break;
  case 10:
    if (0 < size) {
      uVar1 = 0;
      do {
        fVar2 = expf(ptr[uVar1]);
        v0 = v0 + fVar2;
        uVar1 = uVar1 + 1;
      } while ((uint)size != uVar1);
    }
    break;
  default:
    goto switchD_00342145_default;
  }
switchD_00342145_default:
  return v0;
}

Assistant:

static float reduction(float v0, const float* ptr, int size, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size);

    // should never reach here
    return v0;
}